

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForwardInterfaceClassTypedefDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardInterfaceClassTypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5)

{
  Token typedefKeyword;
  Token interfaceKeyword;
  Token classKeyword;
  Token name;
  Token semi;
  ForwardInterfaceClassTypedefDeclarationSyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ForwardInterfaceClassTypedefDeclarationSyntax *)allocate(this,0x90,8);
  typedefKeyword.kind = args_1->kind;
  typedefKeyword._2_1_ = args_1->field_0x2;
  typedefKeyword.numFlags.raw = (args_1->numFlags).raw;
  typedefKeyword.rawLen = args_1->rawLen;
  typedefKeyword.info = args_1->info;
  interfaceKeyword.kind = args_2->kind;
  interfaceKeyword._2_1_ = args_2->field_0x2;
  interfaceKeyword.numFlags.raw = (args_2->numFlags).raw;
  interfaceKeyword.rawLen = args_2->rawLen;
  interfaceKeyword.info = args_2->info;
  classKeyword.kind = args_3->kind;
  classKeyword._2_1_ = args_3->field_0x2;
  classKeyword.numFlags.raw = (args_3->numFlags).raw;
  classKeyword.rawLen = args_3->rawLen;
  classKeyword.info = args_3->info;
  name.kind = args_4->kind;
  name._2_1_ = args_4->field_0x2;
  name.numFlags.raw = (args_4->numFlags).raw;
  name.rawLen = args_4->rawLen;
  name.info = args_4->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  slang::syntax::ForwardInterfaceClassTypedefDeclarationSyntax::
  ForwardInterfaceClassTypedefDeclarationSyntax
            (this_00,args,typedefKeyword,interfaceKeyword,classKeyword,name,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }